

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O3

FString __thiscall OPLMIDIDevice::GetStats(OPLMIDIDevice *this)

{
  byte bVar1;
  char cVar2;
  long in_RSI;
  byte *pbVar3;
  ulong uVar4;
  char star [3];
  char local_2c [4];
  
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x723dac;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_2c[2] = 0x2a;
  local_2c[0] = '\x1c';
  local_2c[1] = 'A';
  if (*(int *)(*(long *)(in_RSI + 0x170) + 0x48) != 0) {
    pbVar3 = (byte *)(in_RSI + 0x18a);
    uVar4 = 0;
    do {
      bVar1 = *pbVar3;
      if ((char)bVar1 < '\0') {
        cVar2 = 'A';
      }
      else {
        cVar2 = 'I';
        if ((bVar1 & 2) == 0) {
          cVar2 = (bVar1 & 1) * '\x04' + 'D';
        }
      }
      local_2c[1] = cVar2;
      FString::AppendCStrPart((FString *)this,local_2c,3);
      uVar4 = uVar4 + 1;
      pbVar3 = pbVar3 + 0x28;
    } while (uVar4 < *(uint *)(*(long *)(in_RSI + 0x170) + 0x48));
  }
  return (FString)(char *)this;
}

Assistant:

FString OPLMIDIDevice::GetStats()
{
	FString out;
	char star[3] = { TEXTCOLOR_ESCAPE, 'A', '*' };
	for (uint i = 0; i < io->OPLchannels; ++i)
	{
		if (channels[i].flags & CH_FREE)
		{
			star[1] = CR_BRICK + 'A';
		}
		else if (channels[i].flags & CH_SUSTAIN)
		{
			star[1] = CR_ORANGE + 'A';
		}
		else if (channels[i].flags & CH_SECONDARY)
		{
			star[1] = CR_BLUE + 'A';
		}
		else
		{
			star[1] = CR_GREEN + 'A';
		}
		out.AppendCStrPart (star, 3);
	}
	return out;
}